

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

void ma_copy_and_apply_volume_and_clip_samples_s16
               (ma_int16 *pDst,ma_int32 *pSrc,ma_uint64 count,float volume)

{
  ma_uint64 mVar1;
  int iVar2;
  
  for (mVar1 = 0; count != mVar1; mVar1 = mVar1 + 1) {
    iVar2 = pSrc[mVar1] * (int)(short)(int)(volume * 256.0) >> 8;
    if (0x7ffe < iVar2) {
      iVar2 = 0x7fff;
    }
    if (iVar2 < -0x7fff) {
      iVar2 = -0x8000;
    }
    pDst[mVar1] = (ma_int16)iVar2;
  }
  return;
}

Assistant:

MA_API void ma_copy_and_apply_volume_and_clip_samples_s16(ma_int16* pDst, const ma_int32* pSrc, ma_uint64 count, float volume)
{
    ma_uint64 iSample;
    ma_int16  volumeFixed;

    MA_ASSERT(pDst != NULL);
    MA_ASSERT(pSrc != NULL);

    volumeFixed = ma_float_to_fixed_16(volume);

    for (iSample = 0; iSample < count; iSample += 1) {
        pDst[iSample] = ma_clip_s16(ma_apply_volume_unclipped_s16(pSrc[iSample], volumeFixed));
    }
}